

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

SwitchStmt * new_switch_stmt(void *expr,List *cases,void *defexpr)

{
  void *any;
  SwitchStmt *pSVar1;
  TreeNode *pTVar2;
  SwitchStmt *stmt;
  void *defexpr_local;
  List *cases_local;
  void *expr_local;
  
  any = malloc(0x28);
  pSVar1 = (SwitchStmt *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node((Token *)0x0,switch_eval);
  (pSVar1->node).eval = pTVar2->eval;
  (pSVar1->node).token = pTVar2->token;
  pSVar1->expr = expr;
  pSVar1->cases = cases;
  pSVar1->t_default = defexpr;
  return pSVar1;
}

Assistant:

SwitchStmt* new_switch_stmt(void* expr, List* cases, void* defexpr){
    SwitchStmt* stmt = new(SwitchStmt);
    stmt->node = tree_node_(NULL, eval_handler(switch_eval));
    stmt->expr = expr;
    stmt->cases = cases;
    stmt->t_default = defexpr;
    return stmt;
}